

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::StringVector::SerializeWithCachedSizes
          (StringVector *this,CodedOutputStream *output)

{
  char *data;
  Type *pTVar1;
  int index;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar2;
  
  iVar2 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
  this_00 = &this->vector_;
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    data = (pTVar1->_M_dataplus)._M_p;
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar1->_M_string_length,SERIALIZE,
               "CoreML.Specification.StringVector.vector");
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteString(1,pTVar1,output);
  }
  return;
}

Assistant:

void StringVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StringVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string vector = 1;
  for (int i = 0, n = this->vector_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->vector(i).data(), this->vector(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.StringVector.vector");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->vector(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StringVector)
}